

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

float duckdb::VectorTryCastStrictOperator<duckdb::TryCast>::Operation<duckdb::string_t,float>
                (string_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  string_t input_00;
  bool bVar1;
  anon_union_16_2_67f50693_for_value in_stack_00000010;
  float output;
  VectorTryCastData *data;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  float *in_stack_ffffffffffffff60;
  string *idx_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  string *in_stack_ffffffffffffff70;
  string local_70 [52];
  float local_3c;
  float local_4;
  
  input_00.value.pointer.prefix = (char  [4])in_stack_ffffffffffffff6c;
  input_00.value.pointer.length = in_stack_ffffffffffffff68;
  input_00.value.pointer.ptr = (char *)in_stack_ffffffffffffff70;
  bVar1 = TryCast::Operation<duckdb::string_t,float>
                    (input_00,in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  if (bVar1) {
    local_4 = local_3c;
  }
  else {
    idx_00 = local_70;
    CastExceptionText<duckdb::string_t,float>((string_t)in_stack_00000010);
    local_4 = HandleVectorCastError::Operation<float>
                        (in_stack_ffffffffffffff70,
                         (ValidityMask *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),(idx_t)idx_00
                         ,(VectorTryCastData *)
                          CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    ::std::__cxx11::string::~string(local_70);
  }
  return local_4;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->parameters.strict))) {
			return output;
		}
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}